

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O1

uint32_t __thiscall fmp4_stream::init_fragment::get_time_scale(init_fragment *this)

{
  uint uVar1;
  pointer puVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  uchar *local_90 [2];
  uchar local_80 [16];
  uchar *local_70 [2];
  uchar local_60 [16];
  uchar *local_50 [2];
  uchar local_40 [16];
  
  puVar2 = (this->moov_box_).box_data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = 8;
  bVar6 = false;
  do {
    uVar5 = (ulong)uVar4;
    if ((ulong)((long)(this->moov_box_).box_data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(this->moov_box_).box_data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start) <= uVar5) {
      bVar6 = false;
      goto LAB_00112e01;
    }
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"trak","");
    if ((((puVar2[uVar5 + 4] != *local_50[0]) || (puVar2[uVar5 + 5] != local_50[0][1])) ||
        (puVar2[uVar5 + 6] != local_50[0][2])) ||
       (bVar3 = true, puVar2[uVar5 + 7] != local_50[0][3])) {
      bVar3 = false;
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    if (bVar3) {
      bVar6 = true;
    }
    else {
      uVar1 = *(uint *)(puVar2 + uVar5);
      uVar4 = uVar4 + (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                      uVar1 << 0x18);
    }
  } while (!bVar6);
  uVar4 = uVar4 + 8;
  bVar6 = false;
  do {
    uVar5 = (ulong)uVar4;
    if ((ulong)((long)(this->moov_box_).box_data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(this->moov_box_).box_data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start) <= uVar5) break;
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"mdia","");
    if (((puVar2[uVar5 + 4] != *local_70[0]) || (puVar2[uVar5 + 5] != local_70[0][1])) ||
       ((puVar2[uVar5 + 6] != local_70[0][2] || (bVar3 = true, puVar2[uVar5 + 7] != local_70[0][3]))
       )) {
      bVar3 = false;
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    if (bVar3) {
      bVar6 = true;
    }
    else {
      uVar1 = *(uint *)(puVar2 + uVar5);
      uVar4 = uVar4 + (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                      uVar1 << 0x18);
    }
  } while (!bVar6);
LAB_00112e01:
  if (bVar6) {
    uVar4 = uVar4 + 8;
    bVar6 = false;
    do {
      uVar5 = (ulong)uVar4;
      if ((ulong)((long)(this->moov_box_).box_data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->moov_box_).box_data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start) <= uVar5) break;
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"mdhd","");
      if (((puVar2[uVar5 + 4] != *local_90[0]) || (puVar2[uVar5 + 5] != local_90[0][1])) ||
         ((puVar2[uVar5 + 6] != local_90[0][2] ||
          (bVar3 = true, puVar2[uVar5 + 7] != local_90[0][3])))) {
        bVar3 = false;
      }
      if (local_90[0] != local_80) {
        operator_delete(local_90[0]);
      }
      if (bVar3) {
        bVar6 = true;
      }
      else {
        uVar1 = *(uint *)(puVar2 + uVar5);
        uVar4 = uVar4 + (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                        uVar1 << 0x18);
      }
    } while (!bVar6);
  }
  else {
    bVar6 = false;
  }
  if (bVar6) {
    if (puVar2[uVar4 + 8] == '\x01') {
      uVar4 = *(uint *)(puVar2 + (ulong)uVar4 + 0x1c);
    }
    else {
      uVar4 = *(uint *)(puVar2 + (ulong)uVar4 + 0x14);
    }
    uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "warning no mdhd box found, required for event message track format",0x42);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    uVar4 = 1;
  }
  return uVar4;
}

Assistant:

uint32_t init_fragment::get_time_scale()
	{
		char *ptr = (char*)moov_box_.box_data_.data();

		bool trak_found = false;
		bool mdia_found = false;
		bool mdhd_found = false;
		uint32_t timescale = 1;

		uint32_t pos = 8;

		// find trak box 
		while (!trak_found && pos < moov_box_.box_data_.size())
		{
			if (f_compare_4cc(ptr + 4 + pos, "trak"))
				trak_found = true;
			else
				pos += fmp4_read_uint32(ptr + pos);
		}
		if (trak_found)
		{
			pos += 8;
			while(!mdia_found && pos < moov_box_.box_data_.size())
			{
				if (f_compare_4cc(ptr + 4 + pos, "mdia"))
					mdia_found = true;
				else
					pos += fmp4_read_uint32(ptr + pos);
			};
		}
		if (mdia_found)
		{
			pos += 8;
			while (!mdhd_found && pos < moov_box_.box_data_.size())
			{
				if (f_compare_4cc(ptr + 4 + pos, "mdhd"))
					mdhd_found = true;
				else
					pos += fmp4_read_uint32(ptr + pos);
			};
		}
		if (mdhd_found)
		{
			uint8_t version = (uint8_t)ptr[pos + 8];
			if (version == 1)
				timescale = fmp4_read_uint32(ptr + pos + 28);
			else
				timescale = fmp4_read_uint32(ptr + pos + 20);
			
			return timescale;
		}
		else
		    std::cout << "warning no mdhd box found, required for event message track format" << std::endl;
		    return timescale;
	
	}